

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O0

uint __thiscall RegVmLoweredModule::FindConstant(RegVmLoweredModule *this,uint value1,uint value2)

{
  uint uVar1;
  uint *puVar2;
  uint local_24;
  uint i;
  uint value2_local;
  uint value1_local;
  RegVmLoweredModule *this_local;
  
  local_24 = 0;
  while( true ) {
    uVar1 = SmallArray<unsigned_int,_256U>::size(&this->constants);
    if (uVar1 <= local_24 + 1) {
      return 0;
    }
    puVar2 = SmallArray<unsigned_int,_256U>::operator[](&this->constants,local_24);
    if ((*puVar2 == value1) &&
       (puVar2 = SmallArray<unsigned_int,_256U>::operator[](&this->constants,local_24 + 1),
       *puVar2 == value2)) break;
    local_24 = local_24 + 2;
  }
  return local_24 + 1;
}

Assistant:

unsigned RegVmLoweredModule::FindConstant(unsigned value1, unsigned value2)
{
	for(unsigned i = 0; i + 1 < constants.size(); i += 2)
	{
		if(constants[i] == value1 && constants[i + 1] == value2)
			return i + 1;
	}

	return 0;
}